

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_strategy_test.cc
# Opt level: O2

void disruptor::test::BlockingStrategy::WaitForDependents_invoker(void)

{
  undefined8 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  basic_wrap_stringstream<char> local_460;
  pointer local_2c8;
  pointer local_2c0;
  pointer local_2b8;
  pointer local_2b0;
  pointer local_2a8;
  pointer local_2a0;
  pointer local_298;
  pointer local_290;
  pointer local_288;
  pointer local_280;
  WaitForDependents t;
  
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_470 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_468 = "";
  memset((basic_wrap_stringstream<char> *)&t,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream((basic_wrap_stringstream<char> *)&t)
  ;
  std::operator<<((ostream *)&t,'\"');
  std::operator<<((ostream *)&t,"WaitForDependents");
  std::operator<<((ostream *)&t,"\" fixture ctor");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_((basic_wrap_stringstream<char> *)&t)
  ;
  local_288 = (pbVar2->_M_dataplus)._M_p;
  local_280 = local_288 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_470,0x192);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)&t);
  StrategyFixture<disruptor::BlockingStrategy>::StrategyFixture
            (&t.super_BOOST_AUTO_TEST_CASE_FIXTURE);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_480 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_478 = "";
  memset(&local_460,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_460);
  std::operator<<((ostream *)&local_460,'\"');
  std::operator<<((ostream *)&local_460,"WaitForDependents");
  std::operator<<((ostream *)&local_460,"\" fixture setup");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_460);
  local_298 = (pbVar2->_M_dataplus)._M_p;
  local_290 = local_298 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_480,0x192);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_460);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_490 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_488 = "";
  memset(&local_460,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_460);
  std::operator<<((ostream *)&local_460,'\"');
  std::operator<<((ostream *)&local_460,"WaitForDependents");
  std::operator<<((ostream *)&local_460,"\" test entry");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_460);
  local_2a8 = (pbVar2->_M_dataplus)._M_p;
  local_2a0 = local_2a8 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_490,0x192);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_460);
  WaitForDependents::test_method(&t);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_4a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_498 = "";
  memset(&local_460,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_460);
  std::operator<<((ostream *)&local_460,'\"');
  std::operator<<((ostream *)&local_460,"WaitForDependents");
  std::operator<<((ostream *)&local_460,"\" fixture teardown");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_460);
  local_2b8 = (pbVar2->_M_dataplus)._M_p;
  local_2b0 = local_2b8 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_4a0,0x192);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_460);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_4b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_4a8 = "";
  memset(&local_460,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_460);
  std::operator<<((ostream *)&local_460,'\"');
  std::operator<<((ostream *)&local_460,"WaitForDependents");
  std::operator<<((ostream *)&local_460,"\" fixture dtor");
  pbVar2 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_460);
  local_2c8 = (pbVar2->_M_dataplus)._M_p;
  local_2c0 = local_2c8 + pbVar2->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_4b0,0x192);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_460);
  StrategyFixture<disruptor::BlockingStrategy>::~StrategyFixture
            (&t.super_BOOST_AUTO_TEST_CASE_FIXTURE);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(WaitForDependents) {
  std::atomic<int64_t> return_value(kInitialCursorValue);

  std::thread waiter([this, &return_value]() {
    return_value.store(strategy.WaitFor(kFirstSequenceValue, cursor,
                                        allDependents(), alerted));
  });

  cursor.IncrementAndGet(1L);
  strategy.SignalAllWhenBlocking();
  // dependents haven't moved, WaitFor() should still block.
  BOOST_CHECK_EQUAL(return_value.load(), kInitialCursorValue);

  sequence_1.IncrementAndGet(1L);
  BOOST_CHECK_EQUAL(return_value.load(), kInitialCursorValue);

  sequence_2.IncrementAndGet(1L);
  BOOST_CHECK_EQUAL(return_value.load(), kInitialCursorValue);

  sequence_3.IncrementAndGet(1L);
  waiter.join();
  BOOST_CHECK_EQUAL(return_value.load(), kFirstSequenceValue);
}